

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall cnn::expr::pick(expr *this,Expression *x,uint *pv)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_2c;
  uint *local_28;
  uint *local_20;
  undefined8 local_18;
  
  arguments = x->pg;
  local_2c = (x->i).t;
  local_20 = &local_2c;
  local_18 = 1;
  local_28 = pv;
  ComputationGraph::add_function<cnn::PickElement,unsigned_int*&>
            ((ComputationGraph *)(this + 8),(initializer_list<cnn::VariableIndex> *)arguments,
             &local_20);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression pick(const Expression& x, unsigned* pv) { return Expression(x.pg, x.pg->add_function<PickElement>({x.i}, pv)); }